

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O3

void __thiscall CStructure::deflab(CStructure *this)

{
  int iVar1;
  size_t sVar2;
  char *__dest;
  char *__s1;
  char sn [2048];
  char local_818 [2048];
  
  __dest = local_818;
  sVar2 = strlen(ModuleName);
  memset(local_818,0,0x800);
  local_818[0] = '@';
  __s1 = this->id;
  if (sVar2 != 0) {
    iVar1 = strncmp(__s1,ModuleName,sVar2);
    if (((iVar1 == 0) && (__s1[sVar2] == '.')) && (__s1[sVar2 + 1] != '\0')) {
      __s1 = __s1 + sVar2 + 1;
      goto LAB_00132ecb;
    }
  }
  __dest = local_818 + 1;
LAB_00132ecb:
  strcpy(__dest,__s1);
  InsertSingleStructLabel(true,local_818,false,this->noffset,true);
  sVar2 = strlen(local_818);
  (local_818 + sVar2)[0] = '.';
  (local_818 + sVar2)[1] = '\0';
  InsertStructSubLabels(local_818,false,this->mnf,0,true);
  return;
}

Assistant:

void CStructure::deflab() {
	const size_t moduleNameLength = strlen(ModuleName);
	char sn[LINEMAX] = { '@', 0 };
	if (moduleNameLength && (0 == strncmp(id, ModuleName, moduleNameLength)) \
		&& ('.' == id[moduleNameLength]) && (id[moduleNameLength+1]))
	{
		// looks like the structure name starts with current module name, use non-global way then
		STRCPY(sn, LINEMAX-1, id + moduleNameLength + 1);
	} else {
		// the structure name does not match current module, use the global "@id" way to define it
		STRCPY(sn+1, LINEMAX-1, id);
	}
	InsertSingleStructLabel(true, sn, false, noffset);
	STRCAT(sn, LINEMAX-1, ".");
	InsertStructSubLabels(sn, false, mnf);
}